

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

int display_objects(nh_objitem *items,int icount,char *title,int how,nh_objresult *pick_list)

{
  int iVar1;
  bool bVar2;
  char *local_148;
  char local_138 [8];
  char buf [256];
  int j;
  int n;
  nh_objresult *pick_list_local;
  int how_local;
  char *title_local;
  int icount_local;
  nh_objitem *items_local;
  
  buf._252_4_ = (*windowprocs.win_display_objects)(items,icount,title,how,pick_list);
  if ((how != 0) && (how != -1)) {
    memcpy(local_138,"(none selected)",0x100);
    log_objmenu(buf._252_4_,pick_list);
    if (buf._252_4_ == 1) {
      buf[0xf8] = '\0';
      buf[0xf9] = '\0';
      buf[0xfa] = '\0';
      buf[0xfb] = '\0';
      while( true ) {
        bVar2 = false;
        if ((int)buf._248_4_ < icount) {
          bVar2 = items[(int)buf._248_4_].id != pick_list->id;
        }
        if (!bVar2) break;
        buf._248_4_ = buf._248_4_ + 1;
      }
      sprintf(local_138,"%c",(ulong)(uint)(int)items[(int)buf._248_4_].accel);
    }
    else if (1 < (int)buf._252_4_) {
      sprintf(local_138,"(%d selected)",(ulong)(uint)buf._252_4_);
    }
    local_148 = title;
    if (title == (char *)0x0) {
      local_148 = "List of objects";
    }
    pline("<%s: %s>",local_148,local_138);
    suppress_more();
  }
  iVar1._0_1_ = buf[0xfc];
  iVar1._1_1_ = buf[0xfd];
  iVar1._2_1_ = buf[0xfe];
  iVar1._3_1_ = buf[0xff];
  return iVar1;
}

Assistant:

int display_objects(struct nh_objitem *items, int icount, const char *title,
		    int how, struct nh_objresult *pick_list)
{
	int n, j;
	n = (*windowprocs.win_display_objects)(items, icount, title, how, pick_list);
	if (how != PICK_NONE && how != PICK_INVACTION) {
	    char buf[BUFSZ] = "(none selected)";
	    log_objmenu(n, pick_list);
	    if (n == 1) {
		for (j = 0; j < icount && items[j].id != pick_list[0].id; j++)
		    /* empty */;
		sprintf(buf, "%c", items[j].accel);
	    } else if (n > 1) {
		sprintf(buf, "(%d selected)", n);
	    }
	    pline("<%s: %s>", title ? title : "List of objects", buf);
	    suppress_more();
	}
	return n;
}